

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcG.c
# Opt level: O1

Bmcg_Man_t * Bmcg_ManStart(Gia_Man_t *pGia,Bmc_AndPar_t *pPars)

{
  int iVar1;
  Bmcg_Man_t *pBVar2;
  Gia_Man_t *p;
  void **ppvVar3;
  int *piVar4;
  bmcg_sat_solver *s;
  size_t sVar5;
  int iVar6;
  long lVar7;
  int Lit;
  int local_24;
  
  pBVar2 = (Bmcg_Man_t *)calloc(1,0x3a8);
  if (pGia->nRegs < 1) {
    __assert_fail("Gia_ManRegNum(pGia) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcG.c"
                  ,0x4d,"Bmcg_Man_t *Bmcg_ManStart(Gia_Man_t *, Bmc_AndPar_t *)");
  }
  pBVar2->pPars = pPars;
  pBVar2->pGia = pGia;
  p = Gia_ManStart(pGia->nObjs * 3);
  pBVar2->pFrames = p;
  Gia_ManHashStart(p);
  pBVar2->pClean = (Gia_Man_t *)0x0;
  if ((pBVar2->vGia2Fr).nCap < 1000) {
    ppvVar3 = (pBVar2->vGia2Fr).pArray;
    if (ppvVar3 == (void **)0x0) {
      ppvVar3 = (void **)malloc(8000);
    }
    else {
      ppvVar3 = (void **)realloc(ppvVar3,8000);
    }
    (pBVar2->vGia2Fr).pArray = ppvVar3;
    (pBVar2->vGia2Fr).nCap = 1000;
  }
  iVar1 = pGia->vCis->nSize;
  iVar6 = iVar1 * 3;
  if ((pBVar2->vFr2Sat).nCap < iVar6) {
    piVar4 = (pBVar2->vFr2Sat).pArray;
    sVar5 = (long)iVar1 * 0xc;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc(sVar5);
    }
    else {
      piVar4 = (int *)realloc(piVar4,sVar5);
    }
    (pBVar2->vFr2Sat).pArray = piVar4;
    if (piVar4 == (int *)0x0) goto LAB_00570437;
    (pBVar2->vFr2Sat).nCap = iVar6;
  }
  Vec_IntPush(&pBVar2->vFr2Sat,0);
  iVar1 = pGia->vCis->nSize;
  iVar6 = iVar1 * 3;
  if ((pBVar2->vCiMap).nCap < iVar6) {
    piVar4 = (pBVar2->vCiMap).pArray;
    sVar5 = (long)iVar1 * 0xc;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc(sVar5);
    }
    else {
      piVar4 = (int *)realloc(piVar4,sVar5);
    }
    (pBVar2->vCiMap).pArray = piVar4;
    if (piVar4 == (int *)0x0) {
LAB_00570437:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (pBVar2->vCiMap).nCap = iVar6;
  }
  if (0 < pBVar2->pPars->nProcs) {
    lVar7 = 0;
    do {
      s = bmcg_sat_solver_start();
      pBVar2->pSats[lVar7] = s;
      bmcg_sat_solver_addvar(s);
      bmcg_sat_solver_addclause(pBVar2->pSats[lVar7],&local_24,1);
      bmcg_sat_solver_set_stop(pBVar2->pSats[lVar7],&pBVar2->fStopNow);
      lVar7 = lVar7 + 1;
    } while (lVar7 < pBVar2->pPars->nProcs);
  }
  pBVar2->nSatVars = 1;
  return pBVar2;
}

Assistant:

Bmcg_Man_t * Bmcg_ManStart( Gia_Man_t * pGia, Bmc_AndPar_t * pPars )
{
    Bmcg_Man_t * p = ABC_CALLOC( Bmcg_Man_t, 1 ); 
    int i, Lit = Abc_Var2Lit( 0, 1 );
//    opts.conf_limit = pPars->nConfLimit;
    assert( Gia_ManRegNum(pGia) > 0 );
    p->pPars   = pPars;
    p->pGia    = pGia;
    p->pFrames = Gia_ManStart( 3*Gia_ManObjNum(pGia) );  Gia_ManHashStart(p->pFrames);
    p->pClean  = NULL;
//    Vec_PtrFill( &p->vGia2Fr, Gia_ManCountTents(pGia)+1, NULL );
//    for ( i = 0; i < Vec_PtrSize(&p->vGia2Fr); i++ )
//        Vec_PtrWriteEntry( &p->vGia2Fr, i, ABC_FALLOC(int, Gia_ManObjNum(pGia)) );
    Vec_PtrGrow( &p->vGia2Fr, 1000 );  
    Vec_IntGrow( &p->vFr2Sat, 3*Gia_ManCiNum(pGia) );  
    Vec_IntPush( &p->vFr2Sat, 0 );
    Vec_IntGrow( &p->vCiMap, 3*Gia_ManCiNum(pGia) );
    for ( i = 0; i < p->pPars->nProcs; i++ )
    {
        p->pSats[i] = bmcg_sat_solver_start();  
//        p->pSats[i]->SolverType = i;
        bmcg_sat_solver_addvar( p->pSats[i] );
        bmcg_sat_solver_addclause( p->pSats[i], &Lit, 1 );  
        bmcg_sat_solver_set_stop( p->pSats[i], &p->fStopNow );
    }
    p->nSatVars = 1;
    return p;
}